

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyDiscrete.cpp
# Opt level: O1

JointPolicyDiscrete * __thiscall
JointPolicyDiscrete::operator=(JointPolicyDiscrete *this,JointPolicyDiscrete *o)

{
  size_t sVar1;
  
  if (this != o) {
    sVar1 = (o->super_JointPolicy)._m_nrAgents;
    (this->super_JointPolicy)._m_depth = (o->super_JointPolicy)._m_depth;
    (this->super_JointPolicy)._m_nrAgents = sVar1;
    this->_m_indexDomCat = o->_m_indexDomCat;
    this->_m_PTPD = o->_m_PTPD;
    boost::shared_ptr<const_Interface_ProblemToPolicyDiscrete>::operator=
              (&this->_m_PTPDshared,&o->_m_PTPDshared);
  }
  return this;
}

Assistant:

JointPolicyDiscrete&
JointPolicyDiscrete::operator= (const JointPolicyDiscrete& o)
{
#if DEBUG_JPOLASSIGN 
    cerr << "JointPolicyDiscrete::operator= (const JointPolicyDiscrete& o) called"<<endl;
#endif
    if (this == &o) return *this;   // Gracefully handle self assignment
    JointPolicy::operator= ( o );   //call parent
    _m_indexDomCat = o._m_indexDomCat;
    _m_PTPD = o._m_PTPD;
    _m_PTPDshared = o._m_PTPDshared;
    return *this;
}